

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

int32_t __thiscall
icu_63::DateTimeMatcher::getDistance
          (DateTimeMatcher *this,DateTimeMatcher *other,int32_t includeMask,
          DistanceInfo *distanceInfo)

{
  int iVar1;
  int local_44;
  int32_t otherType;
  int32_t myType;
  int32_t i;
  int32_t result;
  DistanceInfo *distanceInfo_local;
  int32_t includeMask_local;
  DateTimeMatcher *other_local;
  DateTimeMatcher *this_local;
  
  myType = 0;
  DistanceInfo::clear(distanceInfo);
  for (otherType = 0; otherType < 0x10; otherType = otherType + 1) {
    if ((includeMask & 1 << ((byte)otherType & 0x1f)) == 0) {
      local_44 = 0;
    }
    else {
      local_44 = (this->skeleton).type[otherType];
    }
    iVar1 = (other->skeleton).type[otherType];
    if (local_44 != iVar1) {
      if (local_44 == 0) {
        myType = myType + 0x10000;
        DistanceInfo::addExtra(distanceInfo,otherType);
      }
      else if (iVar1 == 0) {
        myType = myType + 0x1000;
        DistanceInfo::addMissing(distanceInfo,otherType);
      }
      else {
        iVar1 = local_44 - iVar1;
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        myType = iVar1 + myType;
      }
    }
  }
  return myType;
}

Assistant:

int32_t
DateTimeMatcher::getDistance(const DateTimeMatcher& other, int32_t includeMask, DistanceInfo& distanceInfo) const {
    int32_t result = 0;
    distanceInfo.clear();
    for (int32_t i=0; i<UDATPG_FIELD_COUNT; ++i ) {
        int32_t myType = (includeMask&(1<<i))==0 ? 0 : skeleton.type[i];
        int32_t otherType = other.skeleton.type[i];
        if (myType==otherType) {
            continue;
        }
        if (myType==0) {// and other is not
            result += EXTRA_FIELD;
            distanceInfo.addExtra(i);
        }
        else {
            if (otherType==0) {
                result += MISSING_FIELD;
                distanceInfo.addMissing(i);
            }
            else {
                result += abs(myType - otherType);
            }
        }

    }
    return result;
}